

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void prvTidyParseOptGroup(TidyDocImpl *doc,Node *field,GetTokenMode mode)

{
  Bool BVar1;
  Node *node_00;
  Node *node;
  Lexer *lexer;
  GetTokenMode mode_local;
  Node *field_local;
  TidyDocImpl *doc_local;
  
  doc->lexer->insert = (IStack *)0x0;
  while( true ) {
    node_00 = prvTidyGetToken(doc,IgnoreWhitespace);
    if (node_00 == (Node *)0x0) {
      return;
    }
    if ((node_00->tag == field->tag) && (node_00->type == EndTag)) break;
    BVar1 = InsertMisc(field,node_00);
    if (BVar1 == no) {
      if ((node_00->type == StartTag) &&
         ((((node_00 != (Node *)0x0 && (node_00->tag != (Dict *)0x0)) &&
           (node_00->tag->id == TidyTag_OPTION)) ||
          (((node_00 != (Node *)0x0 && (node_00->tag != (Dict *)0x0)) &&
           (node_00->tag->id == TidyTag_OPTGROUP)))))) {
        if (((node_00 != (Node *)0x0) && (node_00->tag != (Dict *)0x0)) &&
           (node_00->tag->id == TidyTag_OPTGROUP)) {
          prvTidyReport(doc,field,node_00,0x231);
        }
        prvTidyInsertNodeAtEnd(field,node_00);
        ParseTag(doc,node_00,MixedContent);
      }
      else {
        prvTidyReport(doc,field,node_00,0x235);
        prvTidyFreeNode(doc,node_00);
      }
    }
  }
  prvTidyFreeNode(doc,node_00);
  field->closed = yes;
  TrimSpaces(doc,field);
  return;
}

Assistant:

void TY_(ParseOptGroup)(TidyDocImpl* doc, Node *field, GetTokenMode ARG_UNUSED(mode))
{
    Lexer* lexer = doc->lexer;
    Node *node;

    lexer->insert = NULL;  /* defer implicit inline start tags */

    while ((node = TY_(GetToken)(doc, IgnoreWhitespace)) != NULL)
    {
        if (node->tag == field->tag && node->type == EndTag)
        {
            TY_(FreeNode)( doc, node);
            field->closed = yes;
            TrimSpaces(doc, field);
            return;
        }

        /* deal with comments etc. */
        if (InsertMisc(field, node))
            continue;

        if ( node->type == StartTag && 
             (nodeIsOPTION(node) || nodeIsOPTGROUP(node)) )
        {
            if ( nodeIsOPTGROUP(node) )
                TY_(Report)(doc, field, node, CANT_BE_NESTED);

            TY_(InsertNodeAtEnd)(field, node);
            ParseTag(doc, node, MixedContent);
            continue;
        }

        /* discard unexpected tags */
        TY_(Report)(doc, field, node, DISCARDING_UNEXPECTED );
        TY_(FreeNode)( doc, node);
    }
}